

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetAdaptivityMethod(void *arkode_mem,int imethod,int idefault,int pq,realtype *adapt_params)

{
  int iVar1;
  realtype rVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetAdaptivityMethod",&ark_mem,&hadapt_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (5 < (uint)imethod) {
    arkProcessError(ark_mem,-0x16,"ARKode","arkSetAdaptivityMethod","Illegal imethod");
    return -0x16;
  }
  hadapt_mem->imethod = imethod;
  hadapt_mem->pq = (uint)(pq != 0);
  if (idefault != 1) {
    hadapt_mem->k1 = *adapt_params;
    hadapt_mem->k2 = adapt_params[1];
    hadapt_mem->k3 = adapt_params[2];
    return 0;
  }
  switch(imethod) {
  case 0:
    hadapt_mem->k1 = 0.58;
    hadapt_mem->k2 = 0.21;
    rVar2 = 0.1;
    goto LAB_004aad09;
  case 1:
    uVar3 = 0x9999999a;
    uVar4 = 0x3fe99999;
    uVar5 = 0x3d70a3d7;
    uVar6 = 0x3fd3d70a;
    break;
  case 2:
    hadapt_mem->k1 = 1.0;
    return 0;
  case 3:
    uVar3 = 0x916872b0;
    uVar4 = 0x3fd77ced;
    uVar5 = 0x78d4fdf4;
    uVar6 = 0x3fd126e9;
    break;
  case 4:
    uVar3 = 0xf5c28f5c;
    uVar4 = 0x3fef5c28;
    uVar5 = 0x66666666;
    uVar6 = 0x3fee6666;
    break;
  case 5:
    hadapt_mem->k1 = 0.367;
    hadapt_mem->k2 = 0.268;
    rVar2 = 0.95;
LAB_004aad09:
    hadapt_mem->k3 = rVar2;
    return 0;
  }
  *(undefined4 *)&hadapt_mem->k1 = uVar3;
  *(undefined4 *)((long)&hadapt_mem->k1 + 4) = uVar4;
  *(undefined4 *)&hadapt_mem->k2 = uVar5;
  *(undefined4 *)((long)&hadapt_mem->k2 + 4) = uVar6;
  return 0;
}

Assistant:

int arkSetAdaptivityMethod(void *arkode_mem, int imethod, int idefault,
                           int pq, realtype adapt_params[3])
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetAdaptivityMethod",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for allowable parameters */
  if ((imethod > ARK_ADAPT_IMEX_GUS) || (imethod < ARK_ADAPT_PID)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetAdaptivityMethod", "Illegal imethod");
    return(ARK_ILL_INPUT);
  }

  /* set adaptivity method */
  hadapt_mem->imethod = imethod;

  /* set flag whether to use p (embedding, 0) or q (method, 1) order */
  hadapt_mem->pq = (pq != 0);

  /* set method parameters */
  if (idefault == 1) {
    switch (hadapt_mem->imethod) {
    case (ARK_ADAPT_PID):
      hadapt_mem->k1 = AD0_K1;
      hadapt_mem->k2 = AD0_K2;
      hadapt_mem->k3 = AD0_K3; break;
    case (ARK_ADAPT_PI):
      hadapt_mem->k1 = AD1_K1;
      hadapt_mem->k2 = AD1_K2; break;
    case (ARK_ADAPT_I):
      hadapt_mem->k1 = AD2_K1; break;
    case (ARK_ADAPT_EXP_GUS):
      hadapt_mem->k1 = AD3_K1;
      hadapt_mem->k2 = AD3_K2; break;
    case (ARK_ADAPT_IMP_GUS):
      hadapt_mem->k1 = AD4_K1;
      hadapt_mem->k2 = AD4_K2; break;
    case (ARK_ADAPT_IMEX_GUS):
      hadapt_mem->k1 = AD5_K1;
      hadapt_mem->k2 = AD5_K2;
      hadapt_mem->k3 = AD5_K3; break;
    }
  } else {
    hadapt_mem->k1 = adapt_params[0];
    hadapt_mem->k2 = adapt_params[1];
    hadapt_mem->k3 = adapt_params[2];
  }

  return(ARK_SUCCESS);
}